

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void evpipe_init(ev_loop *loop)

{
  int iVar1;
  int *piVar2;
  undefined4 local_1c;
  int local_18;
  int local_14;
  int fds [2];
  ev_loop *loop_local;
  
  if ((loop->pipe_w).active == 0) {
    local_18 = -1;
    fds = (int  [2])loop;
    local_14 = eventfd(0,0x80800);
    if ((local_14 < 0) && (piVar2 = __errno_location(), *piVar2 == 0x16)) {
      local_14 = eventfd(0,0);
    }
    if (local_14 < 0) {
      while (iVar1 = pipe(&local_18), iVar1 != 0) {
        ev_syserr("(libev) error creating signal/async pipe");
      }
      fd_intern(local_18);
    }
    *(int *)((long)fds + 0xec) = local_18;
    if (*(int *)((long)fds + 0xf0) < 0) {
      *(int *)((long)fds + 0xf0) = local_14;
    }
    else {
      dup2(local_14,*(int *)((long)fds + 0xf0));
      close(local_14);
    }
    fd_intern(*(int *)((long)fds + 0xf0));
    if (*(int *)((long)fds + 0xec) < 0) {
      local_1c = *(undefined4 *)((long)fds + 0xf0);
    }
    else {
      local_1c = *(undefined4 *)((long)fds + 0xec);
    }
    *(undefined4 *)((long)fds + 0x120) = local_1c;
    *(undefined4 *)((long)fds + 0x124) = 0x81;
    ev_io_start((ev_loop *)fds,(ev_io *)((long)fds + 0xf8));
    ev_unref((ev_loop *)fds);
  }
  return;
}

Assistant:

ecb_cold
evpipe_init (EV_P)
{
  if (!ev_is_active (&pipe_w))
    {
      int fds [2];

# if EV_USE_EVENTFD
      fds [0] = -1;
      fds [1] = eventfd (0, EFD_NONBLOCK | EFD_CLOEXEC);
      if (fds [1] < 0 && errno == EINVAL)
        fds [1] = eventfd (0, 0);

      if (fds [1] < 0)
# endif
        {
          while (pipe (fds))
            ev_syserr ("(libev) error creating signal/async pipe");

          fd_intern (fds [0]);
        }

      evpipe [0] = fds [0];

      if (evpipe [1] < 0)
        evpipe [1] = fds [1]; /* first call, set write fd */
      else
        {
          /* on subsequent calls, do not change evpipe [1] */
          /* so that evpipe_write can always rely on its value. */
          /* this branch does not do anything sensible on windows, */
          /* so must not be executed on windows */

          dup2 (fds [1], evpipe [1]);
          close (fds [1]);
        }

      fd_intern (evpipe [1]);

      ev_io_set (&pipe_w, evpipe [0] < 0 ? evpipe [1] : evpipe [0], EV_READ);
      ev_io_start (EV_A_ &pipe_w);
      ev_unref (EV_A); /* watcher should not keep loop alive */
    }
}